

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
rtc::LogMessage::LogMessage
          (LogMessage *this,char *file,int line,LoggingSeverity sev,LogErrorContext err_ctx,int err,
          char *module)

{
  long lVar1;
  long lVar2;
  uint32_t earlier;
  PlatformThreadId PVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  string local_1c8 [32];
  ostringstream tmp;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->severity_ = sev;
  std::__cxx11::string::string((string *)&this->tag_,"libjingle",(allocator *)&tmp);
  (this->extra_)._M_dataplus._M_p = (pointer)&(this->extra_).field_2;
  (this->extra_)._M_string_length = 0;
  (this->extra_).field_2._M_local_buf[0] = '\0';
  if (timestamp_ == '\x01') {
    earlier = LogStartTime();
    TimeSince(earlier);
    WallClockStartTime();
    poVar4 = std::operator<<((ostream *)this,"[");
    poVar4 = std::operator<<(poVar4,0x30);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,":");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,0x20);
    std::operator<<(poVar4,"] ");
  }
  if (thread_ == '\x01') {
    PVar3 = CurrentThreadId();
    poVar4 = std::operator<<((ostream *)this,"[");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,PVar3);
    std::operator<<(poVar4,"] ");
  }
  if (file != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)this,"(");
    pcVar5 = strrchr(file,0x2f);
    pcVar6 = strrchr(file,0x5c);
    pcVar7 = pcVar6;
    if (pcVar6 < pcVar5) {
      pcVar7 = pcVar5;
    }
    pcVar7 = pcVar7 + 1;
    if (pcVar5 == (char *)0x0 && pcVar6 == (char *)0x0) {
      pcVar7 = file;
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
    std::operator<<(poVar4,"): ");
  }
  if (err_ctx != ERRCTX_NONE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
    poVar4 = std::operator<<((ostream *)&tmp,"[0x");
    poVar4 = std::operator<<(poVar4,0x30);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,err);
    std::operator<<(poVar4,"]");
    if (err_ctx == ERRCTX_EN) {
      poVar4 = std::operator<<((ostream *)&tmp," ");
      pcVar7 = strerror(err);
      std::operator<<(poVar4,pcVar7);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->extra_,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
  }
  return;
}

Assistant:

LogMessage::LogMessage(const char* file,
                       int line,
                       LoggingSeverity sev,
                       LogErrorContext err_ctx,
                       int err,
                       const char* module)
    : severity_(sev), tag_(kLibjingle) {
  if (timestamp_) {
    uint32_t time = TimeSince(LogStartTime());
    // Also ensure WallClockStartTime is initialized, so that it matches
    // LogStartTime.
    WallClockStartTime();
    print_stream_ << "[" << std::setfill('0') << std::setw(3) << (time / 1000)
                  << ":" << std::setw(3) << (time % 1000) << std::setfill(' ')
                  << "] ";
  }

  if (thread_) {
    PlatformThreadId id = CurrentThreadId();
    print_stream_ << "[" << std::dec << id << "] ";
  }

  if (file != NULL)
    print_stream_ << "(" << FilenameFromPath(file)  << ":" << line << "): ";

  if (err_ctx != ERRCTX_NONE) {
    std::ostringstream tmp;
    tmp << "[0x" << std::setfill('0') << std::hex << std::setw(8) << err << "]";
    switch (err_ctx) {
      case ERRCTX_ERRNO:
        tmp << " " << strerror(err);
        break;
#if WEBRTC_WIN
      case ERRCTX_HRESULT: {
        char msgbuf[256];
        DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM;
        HMODULE hmod = GetModuleHandleA(module);
        if (hmod)
          flags |= FORMAT_MESSAGE_FROM_HMODULE;
        if (DWORD len = FormatMessageA(
            flags, hmod, err,
            MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
            msgbuf, sizeof(msgbuf) / sizeof(msgbuf[0]), NULL)) {
          while ((len > 0) &&
              isspace(static_cast<unsigned char>(msgbuf[len-1]))) {
            msgbuf[--len] = 0;
          }
          tmp << " " << msgbuf;
        }
        break;
      }
#endif  // WEBRTC_WIN
#if defined(WEBRTC_MAC) && !defined(WEBRTC_IOS)
      case ERRCTX_OSSTATUS: {
        tmp << " " << nonnull(GetMacOSStatusErrorString(err), "Unknown error");
        if (const char* desc = GetMacOSStatusCommentString(err)) {
          tmp << ": " << desc;
        }
        break;
      }
#endif  // WEBRTC_MAC && !defined(WEBRTC_IOS)
      default:
        break;
    }
    extra_ = tmp.str();
  }
}